

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O2

String * kj::heapString(String *__return_storage_ptr__,char *value,size_t size)

{
  char *__dest;
  
  __dest = _::HeapArrayDisposer::allocate<char>(size + 1);
  if (size != 0) {
    memcpy(__dest,value,size);
  }
  __dest[size] = '\0';
  (__return_storage_ptr__->content).ptr = __dest;
  (__return_storage_ptr__->content).size_ = size + 1;
  (__return_storage_ptr__->content).disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

String heapString(const char* value, size_t size) {
  char* buffer = _::HeapArrayDisposer::allocate<char>(size + 1);
  if (size != 0u) {
    memcpy(buffer, value, size);
  }
  buffer[size] = '\0';
  return String(buffer, size, _::HeapArrayDisposer::instance);
}